

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
llbuild::core::BuildEngine::removeCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  int iVar2;
  CancellationDelegate *local_18;
  
  pvVar1 = this->impl;
  __mutex = (pthread_mutex_t *)((long)pvVar1 + 0x90);
  local_18 = del;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    llvm::
    DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
    ::erase((DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
             *)((long)pvVar1 + 0xf8),&local_18);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void BuildEngine::removeCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->removeCancellationDelegate(del);
}